

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

IVec4 __thiscall
deqp::gles31::Functional::anon_unknown_0::RandomizedRenderGrid::getUsedAreaBoundingBox
          (RandomizedRenderGrid *this)

{
  undefined8 extraout_RDX;
  long in_RSI;
  IVec4 IVar1;
  IVec2 size;
  IVec2 lastCell;
  undefined8 local_28;
  Vector<int,_2> local_20;
  
  local_20.m_data[1] = *(int *)(in_RSI + 0x10);
  local_20.m_data[0] = *(int *)(in_RSI + 0x18) + 1;
  if (local_20.m_data[1] <= local_20.m_data[0]) {
    local_20.m_data[0] = local_20.m_data[1];
  }
  local_20.m_data[1] = (*(int *)(in_RSI + 0x18) + local_20.m_data[1] + -1) / local_20.m_data[1];
  tcu::operator*(&local_20,(Vector<int,_2> *)(in_RSI + 8));
  *(undefined8 *)(this->m_targetSize).m_data = *(undefined8 *)(in_RSI + 0x20);
  *(undefined8 *)(this->m_cellSize).m_data = local_28;
  IVar1.m_data[2] = (int)extraout_RDX;
  IVar1.m_data[3] = (int)((ulong)extraout_RDX >> 0x20);
  IVar1.m_data._0_8_ = this;
  return (IVec4)IVar1.m_data;
}

Assistant:

IVec4 RandomizedRenderGrid::getUsedAreaBoundingBox (void) const
{
	const IVec2 lastCell	(de::min(m_currentCell + 1, m_grid.x()), ((m_currentCell + m_grid.x() - 1) / m_grid.x()));
	const IVec2 size		= lastCell * m_cellSize;

	return IVec4(m_baseRandomOffset.x(), m_baseRandomOffset.y(), size.x(), size.y());
}